

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_binning_array_unaligned.h
# Opt level: O3

Split * __thiscall
embree::sse2::UnalignedHeuristicArrayBinningMB<embree::PrimRefMB,_32UL>::find
          (Split *__return_storage_ptr__,
          UnalignedHeuristicArrayBinningMB<embree::PrimRefMB,_32UL> *this,SetMB *set,
          size_t logBlockSize,LinearSpace3fa *space)

{
  int *piVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  ulong uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  char cVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  runtime_error *this_00;
  undefined1 (*pauVar10) [16];
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  PrimRefMB *ref;
  float fVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  undefined1 auVar24 [16];
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar32;
  float fVar33;
  uint uVar34;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  uint uVar35;
  __m128 afVar36;
  uint uVar37;
  __m128 afVar38;
  float fVar40;
  float fVar41;
  __m128 afVar39;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  __m128 afVar44;
  float fVar50;
  float fVar51;
  __m128 afVar49;
  __m128 afVar52;
  undefined1 auVar53 [16];
  float fVar54;
  float fVar55;
  BinMapping<32UL> mapping;
  Vec3fa center1;
  Vec3fa center0;
  BinBoundsAndCenter binBoundsAndCenter;
  LBBox<embree::Vec3fa> prim1;
  ObjectBinner binner;
  LBBox<embree::Vec3fa> prim0;
  undefined1 local_3820 [16];
  __m128 local_3810;
  __m128 local_3800;
  undefined1 local_37e0 [20];
  float fStack_37cc;
  float fStack_37c8;
  float fStack_37c4;
  float local_37c0 [3];
  uint uStack_37b4;
  long local_37b0;
  PrimRefMB *local_37a0;
  undefined8 uStack_3798;
  ulong local_3790;
  undefined8 uStack_3788;
  PrimRefMB *local_3778;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_3770;
  BinBoundsAndCenter *local_3760;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_3750;
  undefined8 local_3740;
  ulong local_3730;
  BinBoundsAndCenter local_36e0;
  anon_class_8_1_b5464bae local_3698;
  anon_class_16_2_ed117de8_conflict18 local_3690;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_3680;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_3670;
  undefined8 local_3660;
  undefined8 uStack_3658;
  undefined1 local_3650 [16];
  undefined8 local_3640;
  undefined1 auStack_3490 [16];
  undefined1 local_3480 [6652];
  undefined4 uStack_1a84;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a80;
  undefined1 local_1a70 [8];
  float afStack_1a68 [2];
  undefined1 local_1a60 [16];
  undefined1 local_1a50 [16];
  
  local_36e0.scene = this->scene;
  local_36e0.time_range = (set->super_PrimInfoMB).time_range;
  local_36e0.space.vx.field_0._0_8_ = *(undefined8 *)&(space->vx).field_0;
  local_36e0.space.vx.field_0._8_8_ = *(undefined8 *)((long)&(space->vx).field_0 + 8);
  local_36e0.space.vy.field_0._0_8_ = *(undefined8 *)&(space->vy).field_0;
  local_36e0.space.vy.field_0._8_8_ = *(undefined8 *)((long)&(space->vy).field_0 + 8);
  local_36e0.space.vz.field_0._0_8_ = *(undefined8 *)&(space->vz).field_0;
  local_36e0.space.vz.field_0._8_8_ = *(undefined8 *)((long)&(space->vz).field_0 + 8);
  lVar8 = 0x1800;
  pauVar10 = (undefined1 (*) [16])(local_3480 + 0xb0);
  do {
    *(__m128 *)(pauVar10 + -3) = _DAT_01f7a9f0;
    pauVar10[-2] = _DAT_01f7aa00;
    *(__m128 *)(pauVar10 + -1) = _DAT_01f7a9f0;
    *pauVar10 = _DAT_01f7aa00;
    *(__m128 *)(pauVar10 + -7) = _DAT_01f7a9f0;
    pauVar10[-6] = _DAT_01f7aa00;
    *(__m128 *)(pauVar10 + -5) = _DAT_01f7a9f0;
    pauVar10[-4] = _DAT_01f7aa00;
    *(__m128 *)(pauVar10 + -0xb) = _DAT_01f7a9f0;
    pauVar10[-10] = _DAT_01f7aa00;
    *(__m128 *)(pauVar10 + -9) = _DAT_01f7a9f0;
    pauVar10[-8] = _DAT_01f7aa00;
    *(undefined8 *)(local_3480 + lVar8) = 0;
    *(undefined8 *)(local_3480 + lVar8 + 8) = 0;
    lVar8 = lVar8 + 0x10;
    pauVar10 = pauVar10 + 0xc;
  } while (lVar8 != 0x1a00);
  uVar2 = (set->super_PrimInfoMB).object_range._begin;
  uVar3 = (set->super_PrimInfoMB).object_range._end;
  uVar13 = uVar3 - uVar2;
  fVar16 = (float)uVar13 * 0.05 + 4.0;
  uVar9 = (ulong)fVar16;
  uVar9 = (long)(fVar16 - 9.223372e+18) & (long)uVar9 >> 0x3f | uVar9;
  local_37e0._0_8_ = 0x20;
  if (uVar9 < 0x20) {
    local_37e0._0_8_ = uVar9;
  }
  local_37e0._16_4_ =
       (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
       field_0.m128[0];
  fStack_37cc = (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
                lower.field_0.m128[1];
  fStack_37c8 = (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
                lower.field_0.m128[2];
  fStack_37c4 = (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
                lower.field_0.m128[3];
  auVar24._0_4_ =
       (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
       field_0.m128[0] - (float)local_37e0._16_4_;
  auVar24._4_4_ =
       (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
       field_0.m128[1] - fStack_37cc;
  auVar24._8_4_ =
       (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
       field_0.m128[2] - fStack_37c8;
  auVar24._12_4_ =
       (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
       field_0.m128[3] - fStack_37c4;
  auVar30 = maxps(_DAT_01f7bb10,auVar24);
  auVar43._0_4_ = (float)(long)local_37e0._0_8_ * 0.99;
  auVar43._4_4_ = auVar43._0_4_;
  auVar43._8_4_ = auVar43._0_4_;
  auVar43._12_4_ = auVar43._0_4_;
  auVar24 = divps(auVar43,auVar30);
  uStack_37b4 = -(uint)(DAT_01f7bb10._12_4_ < auVar30._12_4_) & auVar24._12_4_;
  local_37c0[0] = (float)(-(uint)((float)DAT_01f7bb10 < auVar30._0_4_) & auVar24._0_4_);
  local_37c0[1] = (float)(-(uint)(DAT_01f7bb10._4_4_ < auVar30._4_4_) & auVar24._4_4_);
  local_37c0[2] = (float)(-(uint)(DAT_01f7bb10._8_4_ < auVar30._8_4_) & auVar24._8_4_);
  local_3778 = set->prims->items;
  if (uVar13 < 0xc00) {
    if (uVar3 != uVar2) {
      local_37b0 = uVar2 * 0x50;
      uStack_3788 = local_3790;
      local_3790 = uVar13;
      uStack_3798 = local_37a0;
      local_37a0 = local_3778;
      if (uVar13 == 1) {
        uVar9 = 0;
      }
      else {
        ref = local_3778 + uVar2 + 1;
        uVar9 = 0;
        do {
          BinBoundsAndCenter::binBoundsAndCenter
                    (&local_36e0,ref + -1,(LBBox3fa *)&local_1a80.field_1,
                     (Vec3fa *)&local_3750.field_1);
          uVar17 = (uint)((local_3750.m128[0] - (float)local_37e0._16_4_) * local_37c0[0] + -0.5);
          uVar19 = (uint)((local_3750.m128[1] - fStack_37cc) * local_37c0[1] + -0.5);
          uVar21 = (uint)((local_3750.m128[2] - fStack_37c8) * local_37c0[2] + -0.5);
          uVar7 = local_37e0._0_4_ - 1;
          uVar26 = -(uint)((int)uVar7 < (int)uVar17);
          uVar27 = -(uint)((int)uVar7 < (int)uVar19);
          uVar28 = -(uint)((int)uVar7 < (int)uVar21);
          uVar17 = ~uVar26 & uVar17 | uVar7 & uVar26;
          uVar19 = ~uVar27 & uVar19 | uVar7 & uVar27;
          uVar26 = ~uVar28 & uVar21 | uVar7 & uVar28;
          BinBoundsAndCenter::binBoundsAndCenter
                    (&local_36e0,ref,(LBBox3fa *)&local_3680.field_1,(Vec3fa *)&local_3770.field_1);
          iVar18 = *(int *)((long)&ref[-1].lbounds.bounds1.lower.field_0 + 0xc);
          uVar4 = (ulong)(-(uint)(0 < (int)uVar19) & uVar19);
          uVar11 = (ulong)(-(uint)(0 < (int)uVar17) & uVar17);
          uVar7 = local_37e0._0_4_ - 1;
          *(int *)(local_3480 + uVar11 * 0x10 + 0x1800) =
               *(int *)(local_3480 + uVar11 * 0x10 + 0x1800) + iVar18;
          auVar30 = local_1a50;
          auVar43 = local_1a60;
          auVar24 = _local_1a70;
          aVar5 = local_1a80;
          lVar8 = uVar11 * 0xc0;
          auVar31 = minps(*(undefined1 (*) [16])(local_3480 + lVar8),(undefined1  [16])local_1a80);
          *(undefined1 (*) [16])(local_3480 + lVar8) = auVar31;
          auVar31 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x10),_local_1a70);
          uVar17 = (uint)((local_3770.m128[0] - (float)local_37e0._16_4_) * local_37c0[0] + -0.5);
          uVar19 = (uint)((local_3770.m128[1] - fStack_37cc) * local_37c0[1] + -0.5);
          uVar21 = (uint)((local_3770.m128[2] - fStack_37c8) * local_37c0[2] + -0.5);
          *(undefined1 (*) [16])(local_3480 + lVar8 + 0x10) = auVar31;
          auVar31 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x20),local_1a60);
          *(undefined1 (*) [16])(local_3480 + lVar8 + 0x20) = auVar31;
          auVar31 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x30),local_1a50);
          *(undefined1 (*) [16])(local_3480 + lVar8 + 0x30) = auVar31;
          uVar27 = -(uint)((int)uVar7 < (int)uVar17);
          uVar28 = -(uint)((int)uVar7 < (int)uVar19);
          uVar37 = -(uint)((int)uVar7 < (int)uVar21);
          *(int *)(local_3480 + uVar4 * 0x10 + 0x1804) =
               *(int *)(local_3480 + uVar4 * 0x10 + 0x1804) + iVar18;
          lVar8 = uVar4 * 0xc0;
          uVar17 = ~uVar27 & uVar17 | uVar7 & uVar27;
          uVar19 = ~uVar28 & uVar19 | uVar7 & uVar28;
          uVar7 = ~uVar37 & uVar21 | uVar7 & uVar37;
          auVar31 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x40),(undefined1  [16])aVar5)
          ;
          *(undefined1 (*) [16])(local_3480 + lVar8 + 0x40) = auVar31;
          auVar31 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x50),auVar24);
          *(undefined1 (*) [16])(local_3480 + lVar8 + 0x50) = auVar31;
          auVar31 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x60),auVar43);
          auVar42 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x70),auVar30);
          *(undefined1 (*) [16])(local_3480 + lVar8 + 0x60) = auVar31;
          uVar11 = (ulong)(-(uint)(0 < (int)uVar26) & uVar26);
          *(undefined1 (*) [16])(local_3480 + lVar8 + 0x70) = auVar42;
          *(int *)(local_3480 + uVar11 * 0x10 + 0x1808) =
               *(int *)(local_3480 + uVar11 * 0x10 + 0x1808) + iVar18;
          lVar8 = uVar11 * 0xc0;
          auVar31 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x80),(undefined1  [16])aVar5)
          ;
          auVar24 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x90),auVar24);
          *(undefined1 (*) [16])(local_3480 + lVar8 + 0x80) = auVar31;
          *(undefined1 (*) [16])(local_3480 + lVar8 + 0x90) = auVar24;
          auVar24 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0xa0),auVar43);
          auVar43 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0xb0),auVar30);
          *(undefined1 (*) [16])(local_3480 + lVar8 + 0xa0) = auVar24;
          *(undefined1 (*) [16])(local_3480 + lVar8 + 0xb0) = auVar43;
          iVar18 = *(int *)((long)&(ref->lbounds).bounds1.lower.field_0 + 0xc);
          uVar11 = (ulong)(-(uint)(0 < (int)uVar17) & uVar17);
          *(int *)(local_3480 + uVar11 * 0x10 + 0x1800) =
               *(int *)(local_3480 + uVar11 * 0x10 + 0x1800) + iVar18;
          lVar8 = uVar11 * 0xc0;
          auVar30._4_4_ = local_3680.m128[1];
          auVar30._0_4_ = local_3680.m128[0];
          auVar30._8_4_ = local_3680.m128[2];
          auVar30._12_2_ = local_3680._12_2_;
          auVar30._14_2_ = local_3680._14_2_;
          auVar31._8_8_ = uStack_3658;
          auVar31._0_8_ = local_3660;
          auVar24 = minps(*(undefined1 (*) [16])(local_3480 + lVar8),auVar30);
          auVar43 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x10),
                          (undefined1  [16])local_3670);
          *(undefined1 (*) [16])(local_3480 + lVar8) = auVar24;
          *(undefined1 (*) [16])(local_3480 + lVar8 + 0x10) = auVar43;
          auVar24 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x20),auVar31);
          auVar43 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x30),local_3650);
          *(undefined1 (*) [16])(local_3480 + lVar8 + 0x20) = auVar24;
          uVar11 = (ulong)(-(uint)(0 < (int)uVar19) & uVar19);
          *(undefined1 (*) [16])(local_3480 + lVar8 + 0x30) = auVar43;
          *(int *)(local_3480 + uVar11 * 0x10 + 0x1804) =
               *(int *)(local_3480 + uVar11 * 0x10 + 0x1804) + iVar18;
          lVar8 = uVar11 * 0xc0;
          auVar24 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x40),auVar30);
          auVar43 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x50),
                          (undefined1  [16])local_3670);
          *(undefined1 (*) [16])(local_3480 + lVar8 + 0x40) = auVar24;
          *(undefined1 (*) [16])(local_3480 + lVar8 + 0x50) = auVar43;
          auVar24 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x60),auVar31);
          auVar43 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x70),local_3650);
          *(undefined1 (*) [16])(local_3480 + lVar8 + 0x60) = auVar24;
          uVar11 = (ulong)(-(uint)(0 < (int)uVar7) & uVar7);
          *(undefined1 (*) [16])(local_3480 + lVar8 + 0x70) = auVar43;
          *(int *)(local_3480 + uVar11 * 0x10 + 0x1808) =
               *(int *)(local_3480 + uVar11 * 0x10 + 0x1808) + iVar18;
          lVar8 = uVar11 * 0xc0;
          auVar24 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x80),auVar30);
          auVar43 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x90),
                          (undefined1  [16])local_3670);
          *(undefined1 (*) [16])(local_3480 + lVar8 + 0x80) = auVar24;
          *(undefined1 (*) [16])(local_3480 + lVar8 + 0x90) = auVar43;
          auVar24 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0xa0),auVar31);
          auVar43 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0xb0),local_3650);
          *(undefined1 (*) [16])(local_3480 + lVar8 + 0xa0) = auVar24;
          *(undefined1 (*) [16])(local_3480 + lVar8 + 0xb0) = auVar43;
          uVar9 = uVar9 + 2;
          ref = ref + 2;
        } while (uVar9 < uVar13 - 1);
      }
      if (uVar9 < local_3790) {
        lVar8 = (long)local_37a0 + local_37b0;
        BinBoundsAndCenter::binBoundsAndCenter
                  (&local_36e0,(PrimRefMB *)(lVar8 + uVar9 * 0x50),(LBBox3fa *)&local_1a80.field_1,
                   (Vec3fa *)&local_3680.field_1);
        uVar17 = (uint)((local_3680.m128[0] - (float)local_37e0._16_4_) * local_37c0[0] + -0.5);
        uVar19 = (uint)((local_3680.m128[1] - fStack_37cc) * local_37c0[1] + -0.5);
        uVar21 = (uint)((local_3680.m128[2] - fStack_37c8) * local_37c0[2] + -0.5);
        uVar7 = local_37e0._0_4_ - 1;
        uVar26 = -(uint)((int)uVar7 < (int)uVar17);
        uVar27 = -(uint)((int)uVar7 < (int)uVar19);
        uVar28 = -(uint)((int)uVar7 < (int)uVar21);
        uVar17 = ~uVar26 & uVar17 | uVar7 & uVar26;
        uVar19 = ~uVar27 & uVar19 | uVar7 & uVar27;
        uVar7 = ~uVar28 & uVar21 | uVar7 & uVar28;
        iVar18 = *(int *)(lVar8 + 0x2c + uVar9 * 0x50);
        uVar9 = (ulong)(-(uint)(0 < (int)uVar17) & uVar17);
        *(int *)(local_3480 + uVar9 * 0x10 + 0x1800) =
             *(int *)(local_3480 + uVar9 * 0x10 + 0x1800) + iVar18;
        lVar8 = uVar9 * 0xc0;
        auVar24 = minps(*(undefined1 (*) [16])(local_3480 + lVar8),(undefined1  [16])local_1a80);
        *(undefined1 (*) [16])(local_3480 + lVar8) = auVar24;
        auVar24 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x10),_local_1a70);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x10) = auVar24;
        auVar24 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x20),local_1a60);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x20) = auVar24;
        auVar24 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x30),local_1a50);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x30) = auVar24;
        uVar9 = (ulong)(-(uint)(0 < (int)uVar19) & uVar19);
        *(int *)(local_3480 + uVar9 * 0x10 + 0x1804) =
             *(int *)(local_3480 + uVar9 * 0x10 + 0x1804) + iVar18;
        lVar8 = uVar9 * 0xc0;
        auVar24 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x40),
                        (undefined1  [16])local_1a80);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x40) = auVar24;
        auVar24 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x50),_local_1a70);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x50) = auVar24;
        auVar24 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x60),local_1a60);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x60) = auVar24;
        auVar24 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x70),local_1a50);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x70) = auVar24;
        uVar9 = (ulong)(-(uint)(0 < (int)uVar7) & uVar7);
        *(int *)(local_3480 + uVar9 * 0x10 + 0x1808) =
             *(int *)(local_3480 + uVar9 * 0x10 + 0x1808) + iVar18;
        lVar8 = uVar9 * 0xc0;
        auVar24 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x80),
                        (undefined1  [16])local_1a80);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x80) = auVar24;
        auVar24 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x90),_local_1a70);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x90) = auVar24;
        auVar24 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0xa0),local_1a60);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0xa0) = auVar24;
        auVar24 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0xb0),local_1a50);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0xb0) = auVar24;
      }
    }
  }
  else {
    local_3770._0_8_ = &local_3778;
    local_3770._8_8_ = local_37e0;
    local_3760 = &local_36e0;
    local_3680._12_2_ = 0x401;
    local_3660 = 0;
    uStack_3658 = 0;
    local_3640 = 8;
    local_3698.mapping = (BinMapping<32UL> *)local_3770._8_8_;
    tbb::detail::r1::initialize((task_group_context *)&local_3680.field_1);
    local_3750._8_8_ = uVar2;
    local_3750._0_8_ = uVar3;
    local_3740 = 0x400;
    local_3690.reduction = &local_3698;
    local_3690.func = (anon_class_24_3_4f408fa6_conflict *)&local_3770;
    tbb::detail::d1::
    parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,_embree::sse2::BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders____builders_______common_algorithms_parallel_reduce_h:59:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders____builders_heuristic_binning_h:525:31)>
              ((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)
               &local_1a80.field_1,(blocked_range<unsigned_long> *)&local_3750.field_1,
               (BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)local_3480,
               &local_3690,&local_3698,(task_group_context *)&local_3680.field_1);
    cVar6 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&local_3680.field_1)
    ;
    if (cVar6 != '\0') {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"task cancelled");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy((task_group_context *)&local_3680.field_1);
    BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_>::operator=
              ((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)local_3480,
               (BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)
               &local_1a80.field_1);
  }
  lVar8 = local_37e0._0_8_ - 1;
  if (lVar8 != 0) {
    lVar12 = local_37e0._0_8_ * 0x10;
    pauVar10 = (undefined1 (*) [16])(auStack_3490 + local_37e0._0_8_ * 0xc0);
    iVar18 = 0;
    iVar20 = 0;
    iVar22 = 0;
    iVar23 = 0;
    lVar14 = 0;
    lVar15 = lVar8;
    auVar24 = _DAT_01f7aa00;
    auVar43 = _DAT_01f7aa00;
    afVar36 = _DAT_01f7a9f0;
    auVar30 = _DAT_01f7aa00;
    afVar38 = _DAT_01f7a9f0;
    afVar39 = _DAT_01f7a9f0;
    afVar44 = _DAT_01f7a9f0;
    auVar31 = _DAT_01f7aa00;
    afVar49 = _DAT_01f7a9f0;
    auVar42 = _DAT_01f7aa00;
    afVar52 = _DAT_01f7a9f0;
    auVar53 = _DAT_01f7aa00;
    do {
      afVar36 = (__m128)minps((undefined1  [16])afVar36,pauVar10[-0xb]);
      auVar43 = maxps(auVar43,pauVar10[-10]);
      afVar39 = (__m128)minps((undefined1  [16])afVar39,pauVar10[-9]);
      auVar53 = maxps(auVar53,pauVar10[-8]);
      fVar16 = auVar43._4_4_ - afVar36[1];
      fVar33 = auVar43._8_4_ - afVar36[2];
      local_3800[0] = auVar53._0_4_;
      local_3800[1] = auVar53._4_4_;
      local_3800[2] = auVar53._8_4_;
      afVar44 = (__m128)minps((undefined1  [16])afVar44,pauVar10[-7]);
      auVar24 = maxps(auVar24,pauVar10[-6]);
      afVar38 = (__m128)minps((undefined1  [16])afVar38,pauVar10[-5]);
      local_3800[1] = local_3800[1] - afVar39[1];
      local_3800[2] = local_3800[2] - afVar39[2];
      auVar30 = maxps(auVar30,pauVar10[-4]);
      fVar40 = auVar24._4_4_ - afVar44[1];
      fVar41 = auVar24._8_4_ - afVar44[2];
      fVar54 = auVar30._4_4_ - afVar38[1];
      fVar55 = auVar30._8_4_ - afVar38[2];
      *(ulong *)(local_3480 + lVar14 + lVar12 + 0x19f0) =
           CONCAT44(((auVar30._0_4_ - afVar38[0]) * (fVar54 + fVar55) + fVar55 * fVar54 +
                    (auVar24._0_4_ - afVar44[0]) * (fVar40 + fVar41) + fVar41 * fVar40) * 0.5,
                    ((local_3800[0] - afVar39[0]) * (local_3800[1] + local_3800[2]) +
                     local_3800[2] * local_3800[1] +
                    (auVar43._0_4_ - afVar36[0]) * (fVar16 + fVar33) + fVar33 * fVar16) * 0.5);
      afVar52 = (__m128)minps((undefined1  [16])afVar52,pauVar10[-3]);
      auVar42 = maxps(auVar42,pauVar10[-2]);
      afVar49 = (__m128)minps((undefined1  [16])afVar49,pauVar10[-1]);
      auVar31 = maxps(auVar31,*pauVar10);
      fVar16 = auVar42._4_4_ - afVar52[1];
      fVar40 = auVar42._8_4_ - afVar52[2];
      fVar33 = auVar31._4_4_ - afVar49[1];
      fVar41 = auVar31._8_4_ - afVar49[2];
      *(float *)(local_3480 + lVar14 + lVar12 + 0x19f8) =
           ((fVar33 + fVar41) * (auVar31._0_4_ - afVar49[0]) + fVar41 * fVar33 +
           (fVar16 + fVar40) * (auVar42._0_4_ - afVar52[0]) + fVar40 * fVar16) * 0.5;
      piVar1 = (int *)(local_3480 + lVar14 + lVar12 + 0x17f0);
      iVar18 = iVar18 + *piVar1;
      iVar20 = iVar20 + piVar1[1];
      iVar22 = iVar22 + piVar1[2];
      iVar23 = iVar23 + piVar1[3];
      piVar1 = (int *)((long)&(&local_3690)[local_37e0._0_8_].reduction + lVar14);
      *piVar1 = iVar18;
      piVar1[1] = iVar20;
      piVar1[2] = iVar22;
      piVar1[3] = iVar23;
      *(undefined4 *)((long)&uStack_1a84 + lVar14 + lVar12) = 0;
      lVar14 = lVar14 + -0x10;
      pauVar10 = pauVar10 + -0xc;
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
  }
  uVar9 = 0xffffffff;
  if ((ulong)local_37e0._0_8_ < 2) {
    local_3770.m128[0] = (float)0;
    local_3770.m128[1] = (float)0;
    local_3770.m128[2] = (float)0;
    local_3770.m128[3] = (float)0;
    local_3810 = _DAT_01f7a9f0;
  }
  else {
    uVar7 = ~(-1 << ((byte)logBlockSize & 0x1f));
    uVar17 = 1;
    uVar19 = 1;
    uVar21 = 1;
    uVar26 = 1;
    iVar18 = 0;
    iVar20 = 0;
    iVar22 = 0;
    iVar23 = 0;
    pauVar10 = (undefined1 (*) [16])(local_3480 + 0xb0);
    lVar15 = 0;
    local_3820 = _DAT_01f7aa00;
    local_3800[0] = _DAT_01f7a9f0;
    local_3800[1] = _UNK_01f7a9f4;
    local_3800[2] = _UNK_01f7a9f8;
    local_3800[3] = _UNK_01f7a9fc;
    local_3810[0] = _DAT_01f7a9f0;
    local_3810[1] = _UNK_01f7a9f4;
    local_3810[2] = _UNK_01f7a9f8;
    local_3810[3] = _UNK_01f7a9fc;
    local_3770.m128[0] = (float)0;
    local_3770.m128[1] = (float)0;
    local_3770.m128[2] = (float)0;
    local_3770.m128[3] = (float)0;
    auVar24 = _DAT_01f7aa00;
    afVar36 = _DAT_01f7a9f0;
    auVar43 = _DAT_01f7aa00;
    afVar38 = _DAT_01f7a9f0;
    afVar39 = _DAT_01f7a9f0;
    auVar30 = _DAT_01f7aa00;
    auVar31 = _DAT_01f7aa00;
    afVar44 = _DAT_01f7a9f0;
    afVar49 = _DAT_01f7a9f0;
    auVar42 = _DAT_01f7aa00;
    do {
      afVar44 = (__m128)minps((undefined1  [16])afVar44,pauVar10[-0xb]);
      auVar31 = maxps(auVar31,pauVar10[-10]);
      afVar36 = (__m128)minps((undefined1  [16])afVar36,pauVar10[-9]);
      auVar43 = maxps(auVar43,pauVar10[-8]);
      afVar39 = (__m128)minps((undefined1  [16])afVar39,pauVar10[-7]);
      auVar42 = maxps(auVar42,pauVar10[-6]);
      fVar50 = auVar31._4_4_ - afVar44[1];
      fVar51 = auVar31._8_4_ - afVar44[2];
      afVar49 = (__m128)minps((undefined1  [16])afVar49,pauVar10[-5]);
      fVar54 = auVar43._4_4_ - afVar36[1];
      fVar55 = auVar43._8_4_ - afVar36[2];
      local_3820 = maxps(local_3820,pauVar10[-4]);
      fVar16 = auVar42._4_4_ - afVar39[1];
      fVar33 = auVar42._8_4_ - afVar39[2];
      local_3800 = (__m128)minps((undefined1  [16])local_3800,pauVar10[-3]);
      fVar45 = local_3820._4_4_ - afVar49[1];
      fVar47 = local_3820._8_4_ - afVar49[2];
      auVar30 = maxps(auVar30,pauVar10[-2]);
      afVar38 = (__m128)minps((undefined1  [16])afVar38,pauVar10[-1]);
      auVar24 = maxps(auVar24,*pauVar10);
      fVar46 = auVar30._4_4_ - local_3800[1];
      fVar48 = auVar30._8_4_ - local_3800[2];
      fVar40 = auVar24._4_4_ - afVar38[1];
      fVar41 = auVar24._8_4_ - afVar38[2];
      iVar18 = iVar18 + *(int *)(local_3480 + lVar15 + 0x1800);
      iVar20 = iVar20 + *(int *)(local_3480 + lVar15 + 0x1804);
      iVar22 = iVar22 + *(int *)(local_3480 + lVar15 + 0x1808);
      iVar23 = iVar23 + *(int *)(local_3480 + lVar15 + 0x180c);
      fVar40 = (auVar24._0_4_ - afVar38[0]) * (fVar40 + fVar41) + fVar41 * fVar40;
      fVar41 = (auVar30._0_4_ - local_3800[0]) * (fVar46 + fVar48) + fVar48 * fVar46;
      local_3730 = logBlockSize & 0xffffffff;
      uVar27 = iVar18 + uVar7 >> local_3730;
      uVar28 = iVar20 + uVar7 >> local_3730;
      uVar37 = iVar22 + uVar7 >> local_3730;
      uVar25 = iVar23 + uVar7 >> local_3730;
      uVar29 = *(int *)((long)&local_3670 + lVar15) + uVar7 >> local_3730;
      uVar32 = *(int *)((long)&local_3670 + lVar15 + 4) + uVar7 >> local_3730;
      uVar34 = *(int *)((long)&local_3670 + lVar15 + 8) + uVar7 >> local_3730;
      uVar35 = *(int *)((long)&local_3670 + lVar15 + 0xc) + uVar7 >> local_3730;
      auVar53._0_4_ =
           ((float)(uVar29 & 0x7fffffff) + (float)((int)uVar29 >> 0x1f & 0x4f000000)) *
           *(float *)(local_1a70 + lVar15) +
           ((float)(uVar27 & 0x7fffffff) + (float)((int)uVar27 >> 0x1f & 0x4f000000)) *
           ((auVar43._0_4_ - afVar36[0]) * (fVar54 + fVar55) + fVar55 * fVar54 +
           (auVar31._0_4_ - afVar44[0]) * (fVar50 + fVar51) + fVar51 * fVar50) * 0.5;
      auVar53._4_4_ =
           ((float)(uVar32 & 0x7fffffff) + (float)((int)uVar32 >> 0x1f & 0x4f000000)) *
           *(float *)(local_1a70 + lVar15 + 4) +
           ((float)(uVar28 & 0x7fffffff) + (float)((int)uVar28 >> 0x1f & 0x4f000000)) *
           ((local_3820._0_4_ - afVar49[0]) * (fVar45 + fVar47) + fVar47 * fVar45 +
           (auVar42._0_4_ - afVar39[0]) * (fVar16 + fVar33) + fVar33 * fVar16) * 0.5;
      auVar53._8_4_ =
           ((float)(uVar34 & 0x7fffffff) + (float)((int)uVar34 >> 0x1f & 0x4f000000)) *
           *(float *)(local_1a70 + lVar15 + 8) +
           ((float)(uVar37 & 0x7fffffff) + (float)((int)uVar37 >> 0x1f & 0x4f000000)) *
           (fVar41 + fVar40) * 0.5;
      auVar53._12_4_ =
           ((float)(uVar35 & 0x7fffffff) + (float)((int)uVar35 >> 0x1f & 0x4f000000)) *
           *(float *)(local_1a70 + lVar15 + 0xc) +
           ((float)(uVar25 & 0x7fffffff) + (float)((int)uVar25 >> 0x1f & 0x4f000000)) *
           (fVar40 + fVar41) * 0.5;
      uVar27 = -(uint)(local_3810[0] <= auVar53._0_4_);
      uVar28 = -(uint)(local_3810[1] <= auVar53._4_4_);
      uVar37 = -(uint)(local_3810[2] <= auVar53._8_4_);
      uVar25 = -(uint)(local_3810[3] <= auVar53._12_4_);
      uVar29 = ~uVar27 & uVar17;
      uVar32 = ~uVar28 & uVar19;
      uVar34 = ~uVar37 & uVar21;
      uVar35 = ~uVar25 & uVar26;
      local_3810 = (__m128)minps(auVar53,(undefined1  [16])local_3810);
      uVar17 = uVar17 + 1;
      uVar19 = uVar19 + 1;
      uVar21 = uVar21 + 1;
      uVar26 = uVar26 + 1;
      pauVar10 = pauVar10 + 0xc;
      local_3770.m128[0] = (float)(uVar29 | (uint)local_3770.m128[0] & uVar27);
      local_3770.m128[1] = (float)(uVar32 | (uint)local_3770.m128[1] & uVar28);
      local_3770.m128[2] = (float)(uVar34 | (uint)local_3770.m128[2] & uVar37);
      local_3770.m128[3] = (float)(uVar35 | (uint)local_3770.m128[3] & uVar25);
      lVar15 = lVar15 + 0x10;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  local_3750.m128[0] = local_3810[0];
  local_3750.m128[1] = local_3810[1];
  local_3750.m128[2] = local_3810[2];
  local_3750.m128[3] = local_3810[3];
  fVar16 = INFINITY;
  uVar13 = 0;
  iVar18 = 0;
  do {
    if ((((local_37c0[uVar13] != 0.0) || (NAN(local_37c0[uVar13]))) &&
        (fVar33 = *(float *)((long)&local_3750 + uVar13 * 4), fVar33 < fVar16)) &&
       (iVar20 = *(int *)((long)&local_3770 + uVar13 * 4), iVar20 != 0)) {
      uVar9 = uVar13 & 0xffffffff;
      iVar18 = iVar20;
      fVar16 = fVar33;
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 3);
  __return_storage_ptr__->dim = (int)uVar9;
  (__return_storage_ptr__->field_2).pos = iVar18;
  __return_storage_ptr__->data = 0;
  (__return_storage_ptr__->mapping).num = local_37e0._0_8_;
  *(ulong *)&(__return_storage_ptr__->mapping).ofs.field_0 = CONCAT44(fStack_37cc,local_37e0._16_4_)
  ;
  *(ulong *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) =
       CONCAT44(fStack_37c4,fStack_37c8);
  *(ulong *)&(__return_storage_ptr__->mapping).scale.field_0 = CONCAT44(local_37c0[1],local_37c0[0])
  ;
  *(ulong *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) =
       CONCAT44(uStack_37b4,local_37c0[2]);
  __return_storage_ptr__->sah =
       fVar16 * ((set->super_PrimInfoMB).time_range.upper - (set->super_PrimInfoMB).time_range.lower
                );
  if ((int)uVar9 == -1) {
    __return_storage_ptr__->data = 1;
  }
  return __return_storage_ptr__;
}

Assistant:

const Split find(const SetMB& set, const size_t logBlockSize, const LinearSpace3fa& space)
        {
          BinBoundsAndCenter binBoundsAndCenter(scene,set.time_range,space);
          ObjectBinner binner(empty);
          const BinMapping<BINS> mapping(set.size(),set.centBounds);
          bin_parallel(binner,set.prims->data(),set.begin(),set.end(),PARALLEL_FIND_BLOCK_SIZE,PARALLEL_THRESHOLD,mapping,binBoundsAndCenter);
          Split osplit = binner.best(mapping,logBlockSize);
          osplit.sah *= set.time_range.size();
          if (!osplit.valid()) osplit.data = Split::SPLIT_FALLBACK; // use fallback split
          return osplit;
        }